

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,int *_woffset,int *_hoffset,int *_doffset,int *_coffset,
          int *_outw,int *_outh,int *_outd,int *_outc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  int iVar10;
  ulong uVar11;
  int *piVar12;
  int *piVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  int *piVar18;
  ulong uVar19;
  uint uVar20;
  int local_48 [6];
  int _axes [4];
  
  uVar1 = bottom_blob->dims;
  uVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar4 = bottom_blob->d;
  uVar5 = bottom_blob->c;
  pvVar7 = (this->starts).data;
  if ((((pvVar7 != (void *)0x0) && ((long)(this->starts).c * (this->starts).cstep != 0)) &&
      (pvVar8 = (this->ends).data, pvVar8 != (void *)0x0)) &&
     ((long)(this->ends).c * (this->ends).cstep != 0)) {
    *_woffset = 0;
    *_hoffset = 0;
    *_doffset = 0;
    *_coffset = 0;
    *_outw = uVar2;
    *_outh = uVar3;
    *_outd = uVar4;
    *_outc = uVar5;
    pvVar9 = (this->axes).data;
    local_48[0] = 0;
    local_48[1] = 1;
    local_48[2] = 2;
    local_48[3] = 3;
    uVar6 = (this->axes).w;
    if (uVar6 == 0) {
      uVar19 = 0;
      if (0 < (int)uVar1) {
        uVar19 = (ulong)uVar1;
      }
    }
    else {
      uVar11 = 0;
      uVar19 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar19 = uVar11;
      }
      for (; uVar19 != uVar11; uVar11 = uVar11 + 1) {
        iVar10 = *(int *)((long)pvVar9 + uVar11 * 4);
        local_48[uVar11] = (iVar10 >> 0x1f & uVar1) + iVar10;
      }
    }
    uVar11 = 0;
    do {
      if (uVar19 == uVar11) {
        return;
      }
      if (uVar1 - 1 < 4) {
        iVar10 = local_48[uVar11];
        iVar14 = *(int *)((long)pvVar7 + uVar11 * 4);
        uVar6 = *(uint *)((long)pvVar8 + uVar11 * 4);
        piVar13 = _woffset;
        piVar18 = _outw;
        uVar16 = uVar2;
        switch(uVar1) {
        case 2:
          piVar13 = _hoffset;
          piVar12 = _woffset;
          piVar18 = _outh;
          piVar17 = _outw;
          uVar16 = uVar3;
          uVar15 = uVar2;
          if (iVar10 != 0) {
LAB_0023ae7d:
            piVar13 = piVar12;
            piVar18 = piVar17;
            uVar16 = uVar15;
            if (iVar10 != 1) goto switchD_0023aeb1_default;
          }
          break;
        case 3:
          piVar13 = _coffset;
          piVar18 = _outc;
          uVar16 = uVar5;
          if ((iVar10 != 0) &&
             (piVar13 = _woffset, piVar12 = _hoffset, piVar18 = _outw, piVar17 = _outh,
             uVar16 = uVar2, uVar15 = uVar3, iVar10 != 2)) goto LAB_0023ae7d;
          break;
        case 4:
          piVar13 = _coffset;
          piVar18 = _outc;
          uVar16 = uVar5;
          switch(iVar10) {
          case 0:
            break;
          case 1:
            piVar13 = _doffset;
            piVar18 = _outd;
            uVar16 = uVar4;
            break;
          case 2:
            piVar13 = _hoffset;
            piVar18 = _outh;
            uVar16 = uVar3;
            break;
          case 3:
            piVar13 = _woffset;
            piVar18 = _outw;
            uVar16 = uVar2;
            break;
          default:
            goto switchD_0023aeb1_default;
          }
        }
        if (iVar14 == -0xe9) {
          iVar14 = 0;
        }
        if (uVar6 == 0xffffff17) {
          uVar6 = uVar16;
        }
        iVar14 = (iVar14 >> 0x1f & uVar16) + iVar14;
        *piVar13 = iVar14;
        uVar15 = 0;
        if ((int)uVar6 < 1) {
          uVar15 = uVar16;
        }
        uVar20 = uVar15 + uVar6;
        if ((int)uVar16 <= (int)(uVar15 + uVar6)) {
          uVar20 = uVar16;
        }
        *piVar18 = uVar20 - iVar14;
      }
switchD_0023aeb1_default:
      uVar11 = uVar11 + 1;
    } while( true );
  }
  *_woffset = this->woffset;
  *_hoffset = this->hoffset;
  *_doffset = this->doffset;
  *_coffset = this->coffset;
  *_outw = uVar2;
  *_outh = uVar3;
  *_outd = uVar4;
  *_outc = uVar5;
  switch(uVar1) {
  case 1:
    iVar14 = uVar2 - (this->woffset + this->woffset2);
    *_outw = iVar14;
    iVar10 = this->outw;
    if (iVar10 != -0xe9) {
      if (iVar14 < iVar10) {
        iVar10 = iVar14;
      }
      *_outw = iVar10;
    }
    break;
  case 2:
    iVar14 = uVar2 - (this->woffset + this->woffset2);
    *_outw = iVar14;
    iVar10 = this->outw;
    if (iVar10 != -0xe9) {
      if (iVar14 < iVar10) {
        iVar10 = iVar14;
      }
      *_outw = iVar10;
    }
    iVar14 = uVar3 - (this->hoffset + this->hoffset2);
    *_outh = iVar14;
    iVar10 = this->outh;
    if (iVar10 != -0xe9) {
      if (iVar14 < iVar10) {
        iVar10 = iVar14;
      }
      *_outh = iVar10;
    }
    break;
  case 3:
    iVar14 = uVar2 - (this->woffset + this->woffset2);
    *_outw = iVar14;
    iVar10 = this->outw;
    if (iVar10 != -0xe9) {
      if (iVar14 < iVar10) {
        iVar10 = iVar14;
      }
      *_outw = iVar10;
    }
    iVar14 = uVar3 - (this->hoffset + this->hoffset2);
    *_outh = iVar14;
    iVar10 = this->outh;
    if (iVar10 != -0xe9) {
      if (iVar14 < iVar10) {
        iVar10 = iVar14;
      }
      *_outh = iVar10;
    }
    goto LAB_0023ad57;
  case 4:
    iVar14 = uVar2 - (this->woffset + this->woffset2);
    *_outw = iVar14;
    iVar10 = this->outw;
    if (iVar10 != -0xe9) {
      if (iVar14 < iVar10) {
        iVar10 = iVar14;
      }
      *_outw = iVar10;
    }
    iVar14 = uVar3 - (this->hoffset + this->hoffset2);
    *_outh = iVar14;
    iVar10 = this->outh;
    if (iVar10 != -0xe9) {
      if (iVar14 < iVar10) {
        iVar10 = iVar14;
      }
      *_outh = iVar10;
    }
    iVar14 = uVar4 - (this->doffset + this->doffset2);
    *_outd = iVar14;
    iVar10 = this->outd;
    if (iVar10 != -0xe9) {
      if (iVar14 < iVar10) {
        iVar10 = iVar14;
      }
      *_outd = iVar10;
    }
LAB_0023ad57:
    iVar14 = uVar5 - (this->coffset + this->coffset2);
    *_outc = iVar14;
    iVar10 = this->outc;
    if (iVar10 != -0xe9) {
      if (iVar14 < iVar10) {
        iVar10 = iVar14;
      }
      *_outc = iVar10;
    }
  }
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, int& _woffset, int& _hoffset, int& _doffset, int& _coffset, int& _outw, int& _outh, int& _outd, int& _outc) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool numpy_style_slice = !starts.empty() && !ends.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _doffset = 0;
        _coffset = 0;
        _outw = w;
        _outh = h;
        _outd = d;
        _outc = channels;

        const int* starts_ptr = starts;
        const int* ends_ptr = ends;
        const int* axes_ptr = axes;

        int _axes[4] = {0, 1, 2, 3};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims;
        }
        else
        {
            for (int i = 0; i < num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + axis;
                _axes[i] = axis;
            }
        }

        for (int i = 0; i < num_axis; i++)
        {
            int axis = _axes[i];
            int start = starts_ptr[i];
            int end = ends_ptr[i];

            if (dims == 1) // axis == 0
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
            if (dims == 2)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 3)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = channels;
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 4)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = channels;
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = d;
                    _doffset = start >= 0 ? start : d + start;
                    _outd = std::min(d, end > 0 ? end : d + end) - _doffset;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 3)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
        }
    }
    else
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _doffset = doffset;
        _coffset = coffset;
        _outw = w;
        _outh = h;
        _outd = d;
        _outc = channels;

        if (dims == 1)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);
        }
        if (dims == 2)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);
        }
        if (dims == 3)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);

            _outc = channels - coffset - coffset2;
            if (outc != -233)
                _outc = std::min(outc, _outc);
        }
        if (dims == 4)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);

            _outd = d - doffset - doffset2;
            if (outd != -233)
                _outd = std::min(outd, _outd);

            _outc = channels - coffset - coffset2;
            if (outc != -233)
                _outc = std::min(outc, _outc);
        }
    }
}